

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_handshake(ptls_t *tls,ptls_buffer_t *_sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  void *pvVar1;
  en_ptls_state_t eVar2;
  size_t sVar3;
  uint8_t *__ptr;
  size_t *psVar4;
  uint8_t description;
  uint uVar5;
  int iVar6;
  size_t consumed;
  st_ptls_record_message_emitter_t emitter;
  size_t local_90;
  ptls_buffer_t local_88;
  ptls_message_emitter_t local_68;
  undefined8 local_40;
  size_t *local_38;
  
  eVar2 = tls->state;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < eVar2) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x1787,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  local_68.enc = &(tls->traffic_protection).enc;
  local_68.record_header_length = 5;
  local_68.begin_message = begin_record_message;
  local_68.commit_message = commit_record_message;
  local_40 = 0;
  local_68.buf = _sendbuf;
  if (eVar2 == PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY) {
    uVar5 = server_finish_handshake(tls,&local_68,1,(st_ptls_signature_algorithms_t *)0x0);
  }
  else if (eVar2 == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x178f,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    uVar5 = send_client_hello(tls,&local_68,properties,(ptls_iovec_t *)0x0);
  }
  else {
    sVar3 = _sendbuf->off;
    pvVar1 = (void *)((long)input + *inlen);
    local_88.base = "";
    local_88.capacity = 0;
    local_88.off = 0;
    local_88._24_8_ = local_88._24_8_ & 0xffffffffffff0000;
    local_38 = inlen;
    if (*inlen == 0) {
      uVar5 = 0x202;
    }
    else {
      do {
        local_90 = (long)pvVar1 - (long)input;
        uVar5 = handle_input(tls,&local_68,&local_88,input,&local_90,properties);
        if (local_88.off != 0) {
          __assert_fail("decryptbuf.off == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                        ,0x17a3,
                        "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                       );
        }
        input = (void *)((long)input + local_90);
      } while ((uVar5 == 0x202) && (input != pvVar1));
    }
    __ptr = local_88.base;
    (*ptls_clear_memory)(local_88.base,local_88.off);
    if (local_88.is_allocated != '\0') {
      free(__ptr);
    }
    psVar4 = local_38;
    local_88.off = 0;
    local_88.is_allocated = '\0';
    local_88.align_bits = '\0';
    local_88._26_6_ = 0;
    local_88.base = (uint8_t *)0x0;
    local_88.capacity = 0;
    if (((9 < uVar5 - 0x202) || ((0x211U >> (uVar5 - 0x202 & 0x1f) & 1) == 0)) && (uVar5 != 0)) {
      if (uVar5 != 0x79) {
        (*ptls_clear_memory)((local_68.buf)->base + sVar3,(local_68.buf)->off - sVar3);
        (local_68.buf)->off = sVar3;
      }
      if ((uVar5 & 0xffffff00) != 0x100) {
        description = 'P';
        if ((uVar5 & 0xffffff00) == 0) {
          description = (uint8_t)uVar5;
        }
        iVar6 = ptls_send_alert(tls,local_68.buf,'\x02',description);
        if (iVar6 != 0) {
          (local_68.buf)->off = sVar3;
        }
      }
    }
    *psVar4 = (long)input + (*psVar4 - (long)pvVar1);
  }
  return uVar5;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *_sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START: {
        assert(input == NULL || *inlen == 0);
        return send_client_hello(tls, &emitter.super, properties, NULL);
    }
    case PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY:
        return server_finish_handshake(tls, &emitter.super, 1, NULL);
    default:
        break;
    }

    const uint8_t *src = input, *const src_end = src + *inlen;
    ptls_buffer_t decryptbuf;

    ptls_buffer_init(&decryptbuf, "", 0);

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (ret == PTLS_ERROR_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, &emitter.super, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    switch (ret) {
    case 0:
    case PTLS_ERROR_IN_PROGRESS:
    case PTLS_ERROR_STATELESS_RETRY:
    case PTLS_ERROR_ASYNC_OPERATION:
        break;
    default:
        /* Flush handshake messages that have been written partially. ECH_REQUIRED sticks out because it is a message sent
         * post-handshake compared to other alerts that are generating *during* the handshake. */
        if (ret != PTLS_ALERT_ECH_REQUIRED) {
            ptls_clear_memory(emitter.super.buf->base + sendbuf_orig_off, emitter.super.buf->off - sendbuf_orig_off);
            emitter.super.buf->off = sendbuf_orig_off;
        }
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (ptls_send_alert(tls, emitter.super.buf, PTLS_ALERT_LEVEL_FATAL,
                                PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                emitter.super.buf->off = sendbuf_orig_off;
        break;
    }

    *inlen -= src_end - src;
    return ret;
}